

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O2

void ay8910_update_one(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  char cVar2;
  DEV_SMPL *__s;
  DEV_SMPL *pDVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  __s = *outputs;
  pDVar3 = outputs[1];
  __n = (ulong)samples * 4;
  memset(__s,0,__n);
  memset(outputs[1],0,__n);
  if (*(char *)((long)param + 0x2ce) == '\0') {
    for (uVar11 = 0; uVar11 != samples; uVar11 = uVar11 + 1) {
      for (lVar6 = 0x30; lVar6 != 0x33; lVar6 = lVar6 + 1) {
        iVar8 = *(int *)((long)param + lVar6 * 4 + -0x9c) + 1;
        *(int *)((long)param + lVar6 * 4 + -0x9c) = iVar8;
        if ((int)((*(byte *)((long)param + lVar6 * 2 + -0x4f) & 0xf) << 8 |
                 (uint)*(byte *)((long)param + lVar6 * 2 + -0x50)) <= iVar8) {
          *(byte *)((long)param + lVar6) = *(byte *)((long)param + lVar6) ^ 1;
          *(undefined4 *)((long)param + lVar6 * 4 + -0x9c) = 0;
        }
      }
      iVar8 = *(int *)((long)param + 0x34) + 1;
      *(int *)((long)param + 0x34) = iVar8;
      if (iVar8 < (int)(*(byte *)((long)param + 0x16) & 0x1f)) {
        uVar5 = *(uint *)((long)param + 0x48);
      }
      else {
        *(undefined4 *)((long)param + 0x34) = 0;
        bVar4 = *(byte *)((long)param + 0x33);
        *(byte *)((long)param + 0x33) = bVar4 ^ 1;
        uVar5 = *(uint *)((long)param + 0x48);
        if (bVar4 != 1) {
          uVar5 = (int)(((uVar5 >> 3 ^ uVar5) & 1) << 0x11 ^ uVar5) >> 1;
          *(uint *)((long)param + 0x48) = uVar5;
        }
      }
      bVar4 = *(byte *)((long)param + 0x17);
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        *(byte *)((long)param + lVar6 + 0x55) =
             (bVar4 >> ((byte)lVar6 + 3 & 0x1f) | (byte)uVar5) &
             (bVar4 >> ((byte)lVar6 & 0x1f) | *(byte *)((long)param + lVar6 + 0x30)) & 1;
      }
      if (*(char *)((long)param + 0x47) == '\0') {
        iVar8 = *(int *)((long)param + 0x38) + 1;
        *(int *)((long)param + 0x38) = iVar8;
        bVar4 = *(byte *)((long)param + 0x3c);
        if ((int)((uint)*(ushort *)((long)param + 0x1b) * *(int *)((long)param + 0x50)) <= iVar8) {
          *(undefined4 *)((long)param + 0x38) = 0;
          bVar4 = bVar4 - 1;
          *(byte *)((long)param + 0x3c) = bVar4;
          if ((char)bVar4 < '\0') {
            if (*(char *)((long)param + 0x44) == '\0') {
              bVar1 = *(byte *)((long)param + 0x4c);
              if ((*(char *)((long)param + 0x45) != '\0') && ((bVar1 + 1 & (int)(char)bVar4) != 0))
              {
                *(byte *)((long)param + 0x46) = *(byte *)((long)param + 0x46) ^ bVar1;
              }
              bVar4 = bVar1 & bVar4;
              *(byte *)((long)param + 0x3c) = bVar4;
            }
            else {
              if (*(char *)((long)param + 0x45) != '\0') {
                *(byte *)((long)param + 0x46) =
                     *(byte *)((long)param + 0x46) ^ *(byte *)((long)param + 0x4c);
              }
              *(undefined1 *)((long)param + 0x47) = 1;
              *(undefined1 *)((long)param + 0x3c) = 0;
              bVar4 = 0;
            }
          }
        }
      }
      else {
        bVar4 = *(byte *)((long)param + 0x3c);
      }
      *(uint *)((long)param + 0x40) = (uint)*(byte *)((long)param + 0x46) ^ (int)(char)bVar4;
      lVar7 = 0x2b8;
      lVar12 = 0;
      for (lVar6 = 0x68; lVar6 != 0x128; lVar6 = lVar6 + 0x40) {
        if (*(int *)((long)param + lVar7 * 4 + -0x824) != 0) {
          bVar4 = *(byte *)((long)param + lVar7 + -0x2a0);
          bVar1 = bVar4 >> 4;
          cVar2 = *(char *)((long)param + lVar7 + -0x263);
          if (((*(char *)((long)param + 0x2cc) == '\x04') * '\x02' + 1U & bVar1) == 0) {
            uVar5 = bVar4 & 0xf;
            if (cVar2 == '\0') {
              uVar5 = 0;
            }
            piVar9 = (int *)(lVar6 + (ulong)uVar5 * 4 + (long)param);
          }
          else if (*(char *)((long)param + 0x2cc) == '\x04') {
            if (cVar2 == '\0') {
              uVar10 = 0;
            }
            else {
              uVar10 = (ulong)(*(uint *)((long)param + 0x40) >> (~bVar1 & 3));
            }
            piVar9 = (int *)((long)param + uVar10 * 4 + lVar12 * 0x80 + 0x128);
          }
          else {
            if (cVar2 == '\0') {
              uVar10 = 0;
            }
            else {
              uVar10 = (ulong)*(uint *)((long)param + 0x40);
            }
            piVar9 = (int *)((long)param + uVar10 * 4 + lVar12 * 0x80 + 0x128);
          }
          iVar8 = *piVar9;
          bVar4 = *(byte *)((long)param + lVar7);
          if ((bVar4 & 1) != 0) {
            piVar9 = __s + uVar11;
            *piVar9 = *piVar9 + iVar8;
            bVar4 = *(byte *)((long)param + lVar7);
          }
          if ((bVar4 & 2) != 0) {
            pDVar3[uVar11] = pDVar3[uVar11] + iVar8;
          }
        }
        lVar12 = lVar12 + 1;
        lVar7 = lVar7 + 1;
      }
    }
  }
  return;
}

Assistant:

void ay8910_update_one(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ay8910_context *psg = (ay8910_context *)param;
	int chan;
	UINT32 cur_smpl;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];
	DEV_SMPL chnout;
	
	memset(outputs[0], 0x00, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0x00, samples * sizeof(DEV_SMPL));
	
	// Speed hack for OPN chips (YM2203, YM26xx), that have an often unused AY8910
	if (psg->IsDisabled)
		return;
	
	/* The 8910 has three outputs, each output is the mix of one of the three */
	/* tone generators and of the (single) noise generator. The two are mixed */
	/* BEFORE going into the DAC. The formula to mix each channel is: */
	/* (ToneOn | ToneDisable) & (NoiseOn | NoiseDisable). */
	/* Note that this means that if both tone and noise are disabled, the output */
	/* is 1, not 0, and can be modulated changing the volume. */

	/* buffering loop */
	for (cur_smpl = 0; cur_smpl < samples; cur_smpl++)
	{
		for (chan = 0; chan < NUM_CHANNELS; chan++)
		{
			psg->count[chan]++;
			if (psg->count[chan] >= TONE_PERIOD(psg, chan))
			{
				psg->output[chan] ^= 1;
				psg->count[chan] = 0;
			}
		}

		psg->count_noise++;
		if (psg->count_noise >= NOISE_PERIOD(psg))
		{
			/* toggle the prescaler output. Noise is no different to
			 * channels.
			 */
			psg->count_noise = 0;
			psg->prescale_noise ^= 1;

			if ( psg->prescale_noise)
			{
				/* The Random Number Generator of the 8910 is a 17-bit shift */
				/* register. The input to the shift register is bit0 XOR bit3 */
				/* (bit0 is the output). This was verified on AY-3-8910 and YM2149 chips. */

				psg->rng ^= (((psg->rng & 1) ^ ((psg->rng >> 3) & 1)) << 17);
				psg->rng >>= 1;
			}
		}

		for (chan = 0; chan < NUM_CHANNELS; chan++)
		{
			psg->vol_enabled[chan] = (psg->output[chan] | TONE_ENABLEQ(psg, chan)) & (NOISE_OUTPUT(psg) | NOISE_ENABLEQ(psg, chan));
		}

		/* update envelope */
		if (psg->holding == 0)
		{
			psg->count_env++;
			if (psg->count_env >= ENVELOPE_PERIOD(psg) * psg->step )
			{
				psg->count_env = 0;
				psg->env_step--;

				/* check envelope current position */
				if (psg->env_step < 0)
				{
					if (psg->hold)
					{
						if (psg->alternate)
							psg->attack ^= psg->env_step_mask;
						psg->holding = 1;
						psg->env_step = 0;
					}
					else
					{
						/* if CountEnv has looped an odd number of times (usually 1), */
						/* invert the output. */
						if (psg->alternate && (psg->env_step & (psg->env_step_mask + 1)))
 							psg->attack ^= psg->env_step_mask;

						psg->env_step &= psg->env_step_mask;
					}
				}

			}
		}
		psg->env_volume = (psg->env_step ^ psg->attack);

#if ENABLE_CUSTOM_OUTPUTS
		if (psg->streams == 3)
#endif
		{
			for (chan = 0; chan < NUM_CHANNELS; chan++)
			{
				if (! psg->MuteMsk[chan])
					continue;
				if (TONE_ENVELOPE(psg, chan) != 0)
				{
					if (psg->chip_type == AYTYPE_AY8914) // AY8914 Has a two bit tone_envelope field
					{
						chnout = psg->env_table[chan][psg->vol_enabled[chan] ? psg->env_volume >> (3-TONE_ENVELOPE(psg,chan)) : 0];
					}
					else
					{
						chnout = psg->env_table[chan][psg->vol_enabled[chan] ? psg->env_volume : 0];
					}
				}
				else
				{
					chnout = psg->vol_table[chan][psg->vol_enabled[chan] ? TONE_VOLUME(psg, chan) : 0];
				}
				if (psg->StereoMask[chan] & 0x01)
					bufL[cur_smpl] += chnout;
				if (psg->StereoMask[chan] & 0x02)
					bufR[cur_smpl] += chnout;
			}
		}
#if ENABLE_CUSTOM_OUTPUTS
		else
		{
			chnout = mix_3D(psg);
			bufL[cur_smpl] += chnout;
			bufR[cur_smpl] += chnout;
		}
#endif
	}
}